

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrDec.c
# Opt level: O3

void Rwr_ManPreprocess(Rwr_Man_t *p)

{
  byte bVar1;
  undefined4 uVar2;
  uint *puVar3;
  Dec_Edge_t DVar4;
  uint uVar5;
  unsigned_short *puVar6;
  Vec_Vec_t *pVVar7;
  void **ppvVar8;
  void *pvVar9;
  Rwr_Node_t *pGraph;
  undefined8 *puVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  Rwr_Node_t *pRVar18;
  
  puVar6 = (unsigned_short *)calloc(1,0x1bc);
  p->pMapInv = puVar6;
  pVVar7 = (Vec_Vec_t *)malloc(0x10);
  pVVar7->nCap = 0xde;
  ppvVar8 = (void **)malloc(0x6f0);
  pVVar7->pArray = ppvVar8;
  lVar14 = 0;
  do {
    pvVar9 = calloc(1,0x10);
    ppvVar8[lVar14] = pvVar9;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xde);
  pVVar7->nSize = 0xde;
  p->vClasses = pVVar7;
  iVar12 = p->nFuncs;
  if (iVar12 < 1) {
    uVar11 = 0xde;
  }
  else {
    lVar14 = 0;
    do {
      pRVar18 = p->pTable[lVar14];
      if (pRVar18 != (Rwr_Node_t *)0x0) {
        do {
          if (*(ushort *)&pRVar18->field_0xe != *(ushort *)&p->pTable[lVar14]->field_0xe) {
            __assert_fail("pNode->uTruth == p->pTable[i]->uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                          ,0x41,"void Rwr_ManPreprocess(Rwr_Man_t *)");
          }
          bVar1 = p->pMap[*(ushort *)&pRVar18->field_0xe];
          if (0xdd < bVar1) {
            __assert_fail("p->pMap[pNode->uTruth] < 222",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                          ,0x42,"void Rwr_ManPreprocess(Rwr_Man_t *)");
          }
          pVVar7 = p->vClasses;
          uVar5 = pVVar7->nSize;
          uVar16 = (uint)bVar1;
          uVar17 = (uint)bVar1;
          if ((int)uVar16 < (int)uVar5) {
            if (uVar5 < bVar1 || uVar5 == uVar16) goto LAB_00446287;
          }
          else {
            iVar12 = bVar1 + 1;
            if (pVVar7->nCap <= (int)uVar16) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)(uint)(iVar12 * 8));
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)(uint)(iVar12 * 8));
                uVar5 = pVVar7->nSize;
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = iVar12;
            }
            if ((int)uVar5 <= (int)uVar17) {
              lVar15 = (long)(int)uVar5;
              iVar13 = (uVar17 - uVar5) + 1;
              do {
                pvVar9 = calloc(1,0x10);
                pVVar7->pArray[lVar15] = pvVar9;
                lVar15 = lVar15 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            pVVar7->nSize = iVar12;
          }
          puVar3 = (uint *)pVVar7->pArray[uVar17];
          uVar5 = puVar3[1];
          if (uVar5 == *puVar3) {
            if ((int)uVar5 < 0x10) {
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x80);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar3 + 2),0x80);
              }
              *(void **)(puVar3 + 2) = pvVar9;
              *puVar3 = 0x10;
            }
            else {
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar9 = malloc((ulong)uVar5 << 4);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar3 + 2),(ulong)uVar5 << 4);
              }
              *(void **)(puVar3 + 2) = pvVar9;
              *puVar3 = uVar5 * 2;
            }
          }
          else {
            pvVar9 = *(void **)(puVar3 + 2);
          }
          uVar5 = puVar3[1];
          puVar3[1] = uVar5 + 1;
          *(Rwr_Node_t **)((long)pvVar9 + (long)(int)uVar5 * 8) = pRVar18;
          p->pMapInv[p->pMap[*(ushort *)&pRVar18->field_0xe]] =
               p->puCanons[*(ushort *)&pRVar18->field_0xe];
          pRVar18 = pRVar18->pNext;
        } while (pRVar18 != (Rwr_Node_t *)0x0);
        iVar12 = p->nFuncs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar12);
    pVVar7 = p->vClasses;
    uVar11 = (ulong)(uint)pVVar7->nSize;
    if (pVVar7->nSize < 1) {
      return;
    }
  }
  lVar14 = 0;
  while (lVar14 < (int)uVar11) {
    pvVar9 = pVVar7->pArray[lVar14];
    if (0 < *(int *)((long)pvVar9 + 4)) {
      lVar15 = 0;
      do {
        pRVar18 = *(Rwr_Node_t **)(*(long *)((long)pvVar9 + 8) + lVar15 * 8);
        if (((ulong)pRVar18 & 1) != 0) {
          __assert_fail("!Rwr_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                        ,0x5f,"Dec_Graph_t *Rwr_NodePreprocess(Rwr_Man_t *, Rwr_Node_t *)");
        }
        if (*(short *)&pRVar18->field_0xe == 0xff) {
          pGraph = (Rwr_Node_t *)calloc(1,0x20);
          pGraph->TravId = 4;
          pGraph->nScore = 4;
          pGraph->nGain = 0;
          *(undefined4 *)&pGraph->nAdded = 0x3a;
          puVar10 = (undefined8 *)malloc(0x570);
          *(undefined8 **)&pGraph->field_0x10 = puVar10;
          *puVar10 = 0;
          puVar10[1] = 0;
          puVar10[2] = 0;
          puVar10[3] = 0;
          puVar10[4] = 0;
          puVar10[5] = 0;
          puVar10[6] = 0;
          puVar10[7] = 0;
          puVar10[8] = 0;
          puVar10[9] = 0;
          puVar10[10] = 0;
          puVar10[0xb] = 0;
          DVar4 = (Dec_Edge_t)0x7;
        }
        else if (*(short *)&pRVar18->field_0xe == 0) {
          pGraph = (Rwr_Node_t *)calloc(1,0x20);
          pGraph->Id = 1;
          DVar4 = (Dec_Edge_t)0x1;
        }
        else {
          pGraph = (Rwr_Node_t *)calloc(1,0x20);
          pGraph->TravId = 4;
          pGraph->nScore = 4;
          pGraph->nGain = 0;
          *(undefined4 *)&pGraph->nAdded = 0x3a;
          puVar10 = (undefined8 *)malloc(0x570);
          *(undefined8 **)&pGraph->field_0x10 = puVar10;
          *puVar10 = 0;
          puVar10[1] = 0;
          puVar10[2] = 0;
          puVar10[3] = 0;
          puVar10[4] = 0;
          puVar10[5] = 0;
          puVar10[6] = 0;
          puVar10[7] = 0;
          puVar10[8] = 0;
          puVar10[9] = 0;
          puVar10[10] = 0;
          puVar10[0xb] = 0;
          Rwr_ManIncTravId(p);
          DVar4 = Rwr_TravCollect_rec(p,pRVar18,(Dec_Graph_t *)pGraph);
        }
        *(Dec_Edge_t *)&pGraph->p0 = DVar4;
        pRVar18->pNext = pGraph;
        uVar2 = *(undefined4 *)&pRVar18->field_0xe;
        uVar5 = Dec_GraphDeriveTruth((Dec_Graph_t *)pGraph);
        if ((short)uVar5 != (short)uVar2) {
          __assert_fail("pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                        ,0x4c,"void Rwr_ManPreprocess(Rwr_Man_t *)");
        }
        pVVar7 = p->vClasses;
        uVar11 = (ulong)pVVar7->nSize;
        if ((long)uVar11 <= lVar14) goto LAB_00446287;
        lVar15 = lVar15 + 1;
        pvVar9 = pVVar7->pArray[lVar14];
      } while (lVar15 < *(int *)((long)pvVar9 + 4));
    }
    lVar14 = lVar14 + 1;
    if ((int)uVar11 <= lVar14) {
      return;
    }
  }
LAB_00446287:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

void Rwr_ManPreprocess( Rwr_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwr_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Guaranteed to be >=0 b/c unsigned
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwr_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwr_NodePreprocess( p, pNode );
        pNode->pNext = (Rwr_Node_t *)pGraph;
        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}